

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  runtime_error *this_00;
  
  uVar2 = (ulong)(byte)this->field_0x8;
  switch(uVar2) {
  case 0:
    break;
  case 2:
    bVar1 = isInt64(this);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"LargestUInt out of Int64 range");
      goto LAB_004f1a00;
    }
  case 1:
    uVar2 = (this->value_).int_;
    break;
  case 3:
    if (9.223372036854776e+18 < ABS((this->value_).real_)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"double out of Int64 range");
      goto LAB_004f1a00;
    }
    uVar2 = (ulong)(this->value_).real_;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to Int64.");
LAB_004f1a00:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    uVar2 = (ulong)(this->value_).bool_;
  }
  return uVar2;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}